

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageRotateCCW(Image *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar5 = GetPixelDataSize(1,1,image->format);
    uVar3 = image->width;
    lVar14 = (long)image->height;
    pvVar6 = malloc((long)(int)(image->height * uVar3 * uVar5));
    if (0 < lVar14) {
      iVar7 = (uVar3 - 1) * uVar5;
      lVar8 = 0;
      pvVar9 = pvVar6;
      do {
        if (0 < (int)uVar3) {
          uVar13 = 0;
          pvVar11 = pvVar9;
          iVar10 = iVar7;
          do {
            if (0 < (int)uVar5) {
              pvVar4 = image->data;
              uVar12 = 0;
              do {
                *(undefined1 *)((long)pvVar11 + uVar12) =
                     *(undefined1 *)((long)pvVar4 + uVar12 + (long)iVar10);
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
            }
            uVar13 = uVar13 + 1;
            pvVar11 = (void *)((long)pvVar11 + (int)uVar5 * lVar14);
            iVar10 = iVar10 - uVar5;
          } while (uVar13 != uVar3);
        }
        lVar8 = lVar8 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar5);
        iVar7 = iVar7 + uVar5 * uVar3;
      } while (lVar8 != lVar14);
    }
    free(image->data);
    image->data = pvVar6;
    uVar1 = image->width;
    uVar2 = image->height;
    image->width = uVar2;
    image->height = uVar1;
  }
  return;
}

Assistant:

void ImageRotateCCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + y))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - x - 1))*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + y)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - x - 1))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}